

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

int Acb_NtkFindSupp3(Acb_Ntk_t *p,int Pivot,sat_solver *pSat,int nVars,int nDivs,Vec_Int_t *vWin,
                    Vec_Int_t *vSupp,int nLutSize,int fDelay)

{
  int iVar1;
  int Shift;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  
  if (fDelay == 0) {
    piVar5 = Acb_ObjFanins(p,Pivot);
    iVar8 = nVars * 6;
    iVar11 = iVar8 + nDivs;
    Shift = nVars * -6;
    lVar13 = 0;
    while (lVar10 = lVar13, lVar10 < *piVar5) {
      iVar1 = piVar5[lVar10 + 1];
      iVar2 = Acb_ObjIsAreaCritical(p,iVar1);
      lVar13 = lVar10 + 1;
      if (iVar2 != 0) {
        piVar6 = Acb_ObjFanins(p,Pivot);
        lVar12 = 0;
        while (lVar12 < *piVar6) {
          lVar9 = lVar12 + 1;
          iVar2 = piVar6[lVar12 + 1];
          iVar3 = Acb_ObjIsAreaCritical(p,iVar2);
          bVar14 = lVar12 != lVar10;
          lVar12 = lVar9;
          if ((bVar14) && (iVar3 != 0)) {
            if (iVar1 == iVar2) {
              __assert_fail("iFanin != iFanin2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                            ,0x400,
                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                           );
            }
            vSupp->nSize = 0;
            piVar7 = Acb_ObjFanins(p,Pivot);
            for (lVar9 = 0; lVar9 < *piVar7; lVar9 = lVar9 + 1) {
              iVar3 = piVar7[lVar9 + 1];
              if (iVar3 != iVar1 && iVar3 != iVar2) {
                iVar4 = Acb_ObjFunc(p,iVar3);
                if (iVar4 < 0) {
                  __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                                ,0x407,
                                "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                               );
                }
                iVar3 = Acb_ObjFunc(p,iVar3);
                iVar3 = Abc_Var2Lit(iVar3 + iVar8,0);
                Vec_IntPush(vSupp,iVar3);
              }
            }
            piVar7 = Acb_ObjFanins(p,iVar1);
            for (lVar9 = 0; lVar9 < *piVar7; lVar9 = lVar9 + 1) {
              iVar3 = piVar7[lVar9 + 1];
              iVar4 = Acb_ObjFunc(p,iVar3);
              if (iVar4 < 0) {
                __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                              ,0x40f,
                              "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                             );
              }
              iVar3 = Acb_ObjFunc(p,iVar3);
              iVar3 = Abc_Var2Lit(iVar3 + iVar11,0);
              Vec_IntPush(vSupp,iVar3);
            }
            piVar7 = Acb_ObjFanins(p,iVar2);
            for (lVar9 = 0; lVar9 < *piVar7; lVar9 = lVar9 + 1) {
              iVar2 = piVar7[lVar9 + 1];
              iVar3 = Acb_ObjFunc(p,iVar2);
              if (iVar3 < 0) {
                __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                              ,0x415,
                              "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                             );
              }
              iVar2 = Acb_ObjFunc(p,iVar2);
              iVar2 = Abc_Var2Lit(iVar2 + iVar11,0);
              Vec_IntPushUnique(vSupp,iVar2);
            }
            iVar2 = Vec_IntCheckUniqueSmall(vSupp);
            if (iVar2 == 0) {
              __assert_fail("Vec_IntCheckUniqueSmall(vSupp)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                            ,0x418,
                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                           );
            }
            iVar2 = sat_solver_solve(pSat,vSupp->pArray,vSupp->pArray + vSupp->nSize,0,0,0,0);
            if (iVar2 == -1) {
              iVar2 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
              Vec_IntShrink(vSupp,iVar2);
              iVar2 = Shift;
              Vec_IntLits2Vars(vSupp,Shift);
              Vec_IntSort(vSupp,iVar2);
              iVar3 = 0;
              for (iVar2 = 0; iVar2 < vSupp->nSize; iVar2 = iVar2 + 1) {
                iVar4 = Vec_IntEntry(vSupp,iVar2);
                if (iVar4 < nDivs) {
                  iVar3 = iVar3 + 1;
                }
                else {
                  Vec_IntWriteEntry(vSupp,iVar2,iVar4 - nDivs);
                }
              }
              if (iVar3 != 0) {
                if (iVar3 < 1) {
                  __assert_fail("NodeMark > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                                ,0x431,
                                "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                               );
                }
                if (vSupp->nSize - iVar3 <= nLutSize) {
                  return iVar3;
                }
              }
            }
          }
        }
      }
    }
    piVar5 = Acb_ObjFanins(p,Pivot);
    lVar13 = 0;
    while (lVar13 < *piVar5) {
      iVar1 = piVar5[lVar13 + 1];
      lVar13 = lVar13 + 1;
      iVar2 = Acb_ObjIsAreaCritical(p,iVar1);
      if (iVar2 != 0) {
        piVar6 = Acb_ObjFanins(p,iVar1);
        lVar10 = 0;
        while (lVar10 < *piVar6) {
          iVar2 = piVar6[lVar10 + 1];
          lVar10 = lVar10 + 1;
          iVar3 = Acb_ObjIsAreaCritical(p,iVar2);
          if (iVar3 != 0) {
            if (iVar1 == iVar2) {
              __assert_fail("iFanin != iFanin2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                            ,0x441,
                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                           );
            }
            vSupp->nSize = 0;
            piVar7 = Acb_ObjFanins(p,Pivot);
            for (lVar12 = 0; lVar12 < *piVar7; lVar12 = lVar12 + 1) {
              iVar3 = piVar7[lVar12 + 1];
              if ((iVar3 != iVar1) && (iVar3 != iVar2)) {
                iVar3 = Acb_ObjFunc(p,iVar3);
                iVar3 = Abc_Var2Lit(iVar3 + iVar8,0);
                Vec_IntPush(vSupp,iVar3);
              }
            }
            piVar7 = Acb_ObjFanins(p,iVar1);
            for (lVar12 = 0; lVar12 < *piVar7; lVar12 = lVar12 + 1) {
              if (piVar7[lVar12 + 1] != iVar2) {
                iVar3 = Acb_ObjFunc(p,piVar7[lVar12 + 1]);
                iVar3 = Abc_Var2Lit(iVar3 + iVar11,0);
                Vec_IntPush(vSupp,iVar3);
              }
            }
            piVar7 = Acb_ObjFanins(p,iVar2);
            for (lVar12 = 0; lVar12 < *piVar7; lVar12 = lVar12 + 1) {
              iVar2 = piVar7[lVar12 + 1];
              iVar3 = Acb_ObjFunc(p,iVar2);
              if (iVar3 < 0) {
                __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                              ,0x451,
                              "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                             );
              }
              iVar2 = Acb_ObjFunc(p,iVar2);
              iVar2 = Abc_Var2Lit(iVar2 + iVar11,0);
              Vec_IntPushUnique(vSupp,iVar2);
            }
            iVar2 = Vec_IntCheckUniqueSmall(vSupp);
            if (iVar2 == 0) {
              __assert_fail("Vec_IntCheckUniqueSmall(vSupp)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                            ,0x454,
                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                           );
            }
            iVar2 = sat_solver_solve(pSat,vSupp->pArray,vSupp->pArray + vSupp->nSize,0,0,0,0);
            if (iVar2 != -1) {
              printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
              __assert_fail("status == l_False",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                            ,0x45d,
                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                           );
            }
            iVar2 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
            Vec_IntShrink(vSupp,iVar2);
            iVar2 = Shift;
            Vec_IntLits2Vars(vSupp,Shift);
            Vec_IntSort(vSupp,iVar2);
            iVar3 = 0;
            for (iVar2 = 0; iVar2 < vSupp->nSize; iVar2 = iVar2 + 1) {
              iVar4 = Vec_IntEntry(vSupp,iVar2);
              if (iVar4 < nDivs) {
                iVar3 = iVar3 + 1;
              }
              else {
                Vec_IntWriteEntry(vSupp,iVar2,iVar4 - nDivs);
              }
            }
            if (iVar3 != 0) {
              if (iVar3 < 1) {
                __assert_fail("NodeMark > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                              ,0x46e,
                              "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                             );
              }
              if (vSupp->nSize - iVar3 <= nLutSize) {
                return iVar3;
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Acb_NtkFindSupp3( Acb_Ntk_t * p, int Pivot, sat_solver * pSat, int nVars, int nDivs, Vec_Int_t * vWin, Vec_Int_t * vSupp, int nLutSize, int fDelay )
{
    int nSuppNew, status, k, iFanin, * pFanins, k2, iFanin2, * pFanins2, k3, iFanin3, * pFanins3, NodeMark;

    if ( fDelay )
        return 0;

    // iterate through pairs of fanins with one fanouts
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
    {
        if ( !Acb_ObjIsAreaCritical(p, iFanin) )
            continue;
        Acb_ObjForEachFaninFast( p, Pivot, pFanins2, iFanin2, k2 )
        {
            if ( !Acb_ObjIsAreaCritical(p, iFanin2) || k2 == k )
                continue;
            // iFanin and iFanin2 have 1 fanout
            assert( iFanin != iFanin2 );

            // collect fanins of the root node
            Vec_IntClear( vSupp );
            Acb_ObjForEachFaninFast( p, Pivot, pFanins3, iFanin3, k3 )
                if ( iFanin3 != iFanin && iFanin3 != iFanin2 )
                {
                    assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                    Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars, 0) );
                }
            NodeMark = Vec_IntSize(vSupp);

            // collect fanins of the second node
            Acb_ObjForEachFaninFast( p, iFanin, pFanins3, iFanin3, k3 )
            {
                assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            }
            // collect fanins of the third node
            Acb_ObjForEachFaninFast( p, iFanin2, pFanins3, iFanin3, k3 )
            {
                assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                Vec_IntPushUnique( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            }
            assert( Vec_IntCheckUniqueSmall(vSupp) );

            // sort fanins by level
            //Vec_IntSelectSortCost( Vec_IntArray(vSupp) + NodeMark, Vec_IntSize(vSupp) - NodeMark, &p->vLevelD );
            // solve for these fanins
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( status != l_False )
                continue;
            assert( status == l_False );
            nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
            Vec_IntShrink( vSupp, nSuppNew );
            Vec_IntLits2Vars( vSupp, -6*nVars );
            Vec_IntSort( vSupp, 1 );
            // count how many belong to H; the rest belong to G
            NodeMark = 0;
            Vec_IntForEachEntry( vSupp, iFanin3, k3 )
                if ( iFanin3 >= nDivs )
                    Vec_IntWriteEntry( vSupp, k3, iFanin3 - nDivs );
                else 
                    NodeMark++;
            if ( NodeMark == 0 )
            {
                //printf( "Obj %d: Special case 1 (vars = %d)\n", Pivot, Vec_IntSize(vSupp) );
                continue;
            }
            assert( NodeMark > 0 );
            if ( Vec_IntSize(vSupp) - NodeMark <= nLutSize )
                return NodeMark;
        }
    }

    // iterate through fanins with one fanout and their fanins with one fanout
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
    {
        if ( !Acb_ObjIsAreaCritical(p, iFanin) )
            continue;
        Acb_ObjForEachFaninFast( p, iFanin, pFanins2, iFanin2, k2 )
        {
            if ( !Acb_ObjIsAreaCritical(p, iFanin2) )
                continue;
            // iFanin and iFanin2 have 1 fanout
            assert( iFanin != iFanin2 );

            // collect fanins of the root node
            Vec_IntClear( vSupp );
            Acb_ObjForEachFaninFast( p, Pivot, pFanins3, iFanin3, k3 )
                if ( iFanin3 != iFanin && iFanin3 != iFanin2 )
                    Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars, 0) );
            NodeMark = Vec_IntSize(vSupp);

            // collect fanins of the second node
            Acb_ObjForEachFaninFast( p, iFanin, pFanins3, iFanin3, k3 )
                if ( iFanin3 != iFanin2 )
                    Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            // collect fanins of the third node
            Acb_ObjForEachFaninFast( p, iFanin2, pFanins3, iFanin3, k3 )
            {
                assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                Vec_IntPushUnique( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            }
            assert( Vec_IntCheckUniqueSmall(vSupp) );

            // sort fanins by level
            //Vec_IntSelectSortCost( Vec_IntArray(vSupp) + NodeMark, Vec_IntSize(vSupp) - NodeMark, &p->vLevelD );
            //Sat_SolverWriteDimacs( pSat, NULL, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0 );
            // solve for these fanins
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( status != l_False )
                printf( "Failed internal check at node %d.\n", Pivot );
            assert( status == l_False );
            nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
            Vec_IntShrink( vSupp, nSuppNew );
            Vec_IntLits2Vars( vSupp, -6*nVars );
            Vec_IntSort( vSupp, 1 );
            // count how many belong to H; the rest belong to G
            NodeMark = 0;
            Vec_IntForEachEntry( vSupp, iFanin3, k3 )
                if ( iFanin3 >= nDivs )
                    Vec_IntWriteEntry( vSupp, k3, iFanin3 - nDivs );
                else 
                    NodeMark++;
            if ( NodeMark == 0 )
            {
                //printf( "Obj %d: Special case 2 (vars = %d)\n", Pivot, Vec_IntSize(vSupp) );
                continue;
            }
            assert( NodeMark > 0 );
            if ( Vec_IntSize(vSupp) - NodeMark <= nLutSize )
                return NodeMark;
        }
    }

    return 0;
}